

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchSimSat.c
# Opt level: O1

void Dch_ManResimulateCex(Dch_Man_t *p,Aig_Obj_t *pObj,Aig_Obj_t *pRepr)

{
  Aig_Obj_t *pRepr_00;
  int iVar1;
  Aig_Obj_t **ppAVar2;
  long lVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  int iVar6;
  bool bVar7;
  int nSize;
  timespec ts;
  int local_58;
  int local_54;
  timespec local_50;
  Aig_Obj_t *local_40;
  long local_38;
  
  iVar1 = clock_gettime(3,&local_50);
  if (iVar1 < 0) {
    lVar3 = 1;
  }
  else {
    lVar3 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar3 = ((lVar3 >> 7) - (lVar3 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  Dch_ManCollectTfoCands(p,pObj,pRepr);
  p->nConeThis = 0;
  Aig_ManIncrementTravId(p->pAigTotal);
  p->pAigTotal->pConst1->TravId = p->pAigTotal->nTravIds;
  Dch_ManResimulateSolved_rec(p,pObj);
  Dch_ManResimulateSolved_rec(p,pRepr);
  iVar1 = p->nConeThis;
  if (p->nConeThis < p->nConeMax) {
    iVar1 = p->nConeMax;
  }
  p->nConeMax = iVar1;
  pVVar4 = p->vSimRoots;
  if (0 < pVVar4->nSize) {
    lVar5 = 0;
    do {
      Dch_ManResimulateOther_rec(p,(Aig_Obj_t *)pVVar4->pArray[lVar5]);
      lVar5 = lVar5 + 1;
      pVVar4 = p->vSimRoots;
    } while (lVar5 < pVVar4->nSize);
  }
  iVar6 = 0;
  iVar1 = Dch_ClassesRefineConst1Group(p->ppClasses,pVVar4,0);
  pVVar4 = p->vSimClasses;
  if (pVVar4->nSize < 1) {
    bVar7 = true;
  }
  else {
    lVar5 = 0;
    local_54 = iVar1;
    local_40 = pRepr;
    local_38 = lVar3;
    do {
      pRepr_00 = (Aig_Obj_t *)pVVar4->pArray[lVar5];
      ppAVar2 = Dch_ClassesReadClass(p->ppClasses,pRepr_00,&local_58);
      if (0 < local_58) {
        lVar3 = 0;
        do {
          Dch_ManResimulateOther_rec(p,ppAVar2[lVar3]);
          lVar3 = lVar3 + 1;
        } while (lVar3 < local_58);
      }
      iVar1 = Dch_ClassesRefineOneClass(p->ppClasses,pRepr_00,0);
      iVar6 = iVar6 + iVar1;
      lVar5 = lVar5 + 1;
      pVVar4 = p->vSimClasses;
    } while (lVar5 < pVVar4->nSize);
    bVar7 = iVar6 == 0;
    pRepr = local_40;
    lVar3 = local_38;
    iVar1 = local_54;
  }
  if (((ulong)pRepr & 1) == 0) {
    if ((*(uint *)&pRepr->field_0x18 & 7) == 1) {
      if (iVar1 == 0) {
        __assert_fail("RetValue1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchSimSat.c"
                      ,0xd0,"void Dch_ManResimulateCex(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
      }
    }
    else if (bVar7) {
      __assert_fail("RetValue2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/dch/dchSimSat.c"
                    ,0xd2,"void Dch_ManResimulateCex(Dch_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    iVar1 = clock_gettime(3,&local_50);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    p->timeSimSat = p->timeSimSat + lVar5 + lVar3;
    return;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
}

Assistant:

void Dch_ManResimulateCex( Dch_Man_t * p, Aig_Obj_t * pObj, Aig_Obj_t * pRepr )
{
    Aig_Obj_t * pRoot, ** ppClass;
    int i, k, nSize, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    // get the equivalence classes
    Dch_ManCollectTfoCands( p, pObj, pRepr );
    // resimulate the cone of influence of the solved nodes
    p->nConeThis = 0;
    Aig_ManIncrementTravId( p->pAigTotal );
    Aig_ObjSetTravIdCurrent( p->pAigTotal, Aig_ManConst1(p->pAigTotal) );
    Dch_ManResimulateSolved_rec( p, pObj );
    Dch_ManResimulateSolved_rec( p, pRepr );
    p->nConeMax = Abc_MaxInt( p->nConeMax, p->nConeThis );
    // resimulate the cone of influence of the other nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimRoots, pRoot, i )
        Dch_ManResimulateOther_rec( p, pRoot );
    // refine these nodes
    RetValue1 = Dch_ClassesRefineConst1Group( p->ppClasses, p->vSimRoots, 0 );
    // resimulate the cone of influence of the cand classes
    RetValue2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vSimClasses, pRoot, i )
    {
        ppClass = Dch_ClassesReadClass( p->ppClasses, pRoot, &nSize );
        for ( k = 0; k < nSize; k++ )
            Dch_ManResimulateOther_rec( p, ppClass[k] );
        // refine this class
        RetValue2 += Dch_ClassesRefineOneClass( p->ppClasses, pRoot, 0 );
    }
    // make sure refinement happened
    if ( Aig_ObjIsConst1(pRepr) )
        assert( RetValue1 );
    else
        assert( RetValue2 );
p->timeSimSat += Abc_Clock() - clk;
}